

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnenum * rnn_findenum(rnndb *db,char *name)

{
  int iVar1;
  int local_24;
  int i;
  char *name_local;
  rnndb *db_local;
  
  local_24 = 0;
  while( true ) {
    if (db->enumsnum <= local_24) {
      return (rnnenum *)0x0;
    }
    iVar1 = strcmp(db->enums[local_24]->name,name);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return db->enums[local_24];
}

Assistant:

struct rnnenum *rnn_findenum (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->enumsnum; i++)
		if (!strcmp(db->enums[i]->name, name))
			return db->enums[i];
	return 0;
}